

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

ScopedElement * __thiscall
Catch::XmlWriter::ScopedElement::operator=(ScopedElement *this,ScopedElement *other)

{
  if (this->m_writer != (XmlWriter *)0x0) {
    endElement(this->m_writer,Newline|Indent);
  }
  this->m_writer = other->m_writer;
  other->m_writer = (XmlWriter *)0x0;
  this->m_fmt = other->m_fmt;
  other->m_fmt = None;
  return this;
}

Assistant:

XmlWriter::ScopedElement& XmlWriter::ScopedElement::operator=( ScopedElement&& other ) noexcept {
        if ( m_writer ) {
            m_writer->endElement();
        }
        m_writer = other.m_writer;
        other.m_writer = nullptr;
        m_fmt = other.m_fmt;
        other.m_fmt = XmlFormatting::None;
        return *this;
    }